

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_reader.cc
# Opt level: O1

bool __thiscall FileReader::nextPacket(FileReader *this,array<unsigned_char,_892UL> *out)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pbVar1;
  ostream *poVar2;
  runtime_error *this_01;
  stringstream ss;
  string asStack_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  this_00 = &this->files_;
  do {
    if (*(int *)(&this->field_0x40 + *(long *)(*(long *)&this->ifs_ + -0x18)) != 0) {
      if ((this->files_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (this->files_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        return false;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Reading: ",9);
      pbVar1 = (this->files_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      std::ifstream::close();
      std::ifstream::open((string *)&this->ifs_,
                          (_Ios_Openmode)
                          (this->files_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      if (*(int *)(&this->field_0x40 + *(long *)(*(long *)&this->ifs_ + -0x18)) != 0) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Unable to open ",0xf);
        pbVar1 = (this_00->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(this_01,asStack_1d8);
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(this_00,(this_00->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    }
    std::istream::read((char *)&this->ifs_,(long)out);
    if (((&this->field_0x40)[*(long *)(*(long *)&this->ifs_ + -0x18)] & 2) == 0) {
      return true;
    }
  } while( true );
}

Assistant:

bool FileReader::nextPacket(std::array<uint8_t, 892>& out) {
  for (;;) {
    // Make sure the ifstream is OK
    if (!ifs_.good() || ifs_.eof()) {
      if (files_.size() == 0) {
        return false;
      }

      // Open next file
      std::cout << "Reading: " << files_.front() << std::endl;
      ifs_.close();
      ifs_.open(files_.front());
      if (!ifs_.good()) {
        std::stringstream ss;
        ss << "Unable to open " << files_.front();
        throw std::runtime_error(ss.str());
      }
      files_.erase(files_.begin());
    }

    ifs_.read((char*) out.data(), out.size());
    if (ifs_.eof()) {
      continue;
    }

    return true;
  }
}